

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O1

void __thiscall Tank::serverLoop(Tank *this)

{
  fd_set *__readfds;
  __fd_mask *p_Var1;
  uint __fd;
  char *__ptr;
  bool bVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  fd_set *pfVar10;
  Tank *this_00;
  fd_set *pfVar11;
  uint __fd_00;
  ulong uVar12;
  byte bVar13;
  char *remoteAddr;
  socklen_t sockaddrLength;
  sockaddr_in sockaddr;
  char *local_70;
  socklen_t local_64;
  fd_set *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar13 = 0;
  if (this->serverCreated == false) {
    bVar2 = createServer(this);
    this->serverCreated = bVar2;
  }
  local_60 = &this->master;
  __readfds = &this->tmpSet;
  pfVar10 = local_60;
  pfVar11 = __readfds;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pfVar11->fds_bits[0] = pfVar10->fds_bits[0];
    pfVar10 = (fd_set *)((long)pfVar10 + (ulong)bVar13 * -0x10 + 8);
    pfVar11 = (fd_set *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  iVar3 = select(this->fdMax + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  if (iVar3 != -1) {
    local_58 = (string *)&this->command;
    do {
      if (-1 < this->fdMax) {
        uVar9 = (uint)this->fdMax >> 0x1f;
        uVar12 = 0xffffffff;
        do {
          __fd_00 = (int)uVar12 + 1;
          uVar12 = (ulong)__fd_00;
          if (((ulong)__readfds->fds_bits[__fd_00 >> 6] >> (uVar12 & 0x3f) & 1) != 0) {
            __fd = this->listener;
            this_00 = (Tank *)(ulong)__fd;
            if (__fd_00 == __fd) {
              if (this->clientConnected == false) {
                local_64 = 0x10;
                iVar3 = accept(__fd,(sockaddr *)local_50,&local_64);
                this->newSock = iVar3;
                if (iVar3 == -1) {
                  puts("Cannot accept connection");
                }
                else {
                  iVar4 = iVar3 + 0x3f;
                  if (-1 < iVar3) {
                    iVar4 = iVar3;
                  }
                  p_Var1 = (this->master).fds_bits + (iVar4 >> 6);
                  *p_Var1 = *p_Var1 | 1L << ((byte)iVar3 & 0x3f);
                  if (this->fdMax < iVar3) {
                    this->fdMax = iVar3;
                  }
                  getAddress(this_00,(sockaddr *)local_50,&local_70);
                  __ptr = local_70;
                  printf("Connection accepted from IP %s\n",local_70);
                  free(__ptr);
                }
                if (iVar3 == -1) {
                  if (uVar9 == 0) {
                    return;
                  }
                  break;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Different client tried to connect",0x21);
              }
            }
            else {
              sVar5 = recv(__fd_00,&local_70,2,0);
              uVar9 = (uint)sVar5;
              if ((int)uVar9 < 1) {
                if (uVar9 == 0) {
                  printf("Socket %d is closed\n",(ulong)__fd_00);
                }
                else {
                  perror("recv");
                }
                close(__fd_00);
                local_60->fds_bits[__fd_00 >> 6] =
                     local_60->fds_bits[__fd_00 >> 6] & ~(1L << ((byte)__fd_00 & 0x3f));
              }
              else {
                sVar5 = send(__fd_00,&local_70,(ulong)(uVar9 & 0x7fffffff),0);
                if (sVar5 == -1) {
                  perror("send");
                }
                local_50[0] = local_40;
                sVar6 = strlen((char *)&local_70);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_50,&local_70,(long)&local_70 + sVar6);
                std::__cxx11::string::operator=(local_58,(string *)local_50);
                if (local_50[0] != local_40) {
                  operator_delete(local_50[0]);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"we got command! ",0x10);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(this->command)._M_dataplus._M_p,
                                    (this->command)._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
            }
          }
          uVar9 = (uint)(this->fdMax <= (int)__fd_00);
        } while ((int)__fd_00 < this->fdMax);
      }
      pfVar10 = local_60;
      pfVar11 = __readfds;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pfVar11->fds_bits[0] = pfVar10->fds_bits[0];
        pfVar10 = (fd_set *)((long)pfVar10 + (ulong)bVar13 * -0x10 + 8);
        pfVar11 = (fd_set *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
      }
      iVar3 = select(this->fdMax + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0)
      ;
    } while (iVar3 != -1);
  }
  perror("select");
  return;
}

Assistant:

void Tank::serverLoop()
{
    if(!serverCreated)
        serverCreated = this->createServer();
        // Run until the cows come home
        while (1) {
            // work with copy of master set
            tmpSet = master;
            // wait for data
            if (select(fdMax+1, &tmpSet, NULL, NULL, NULL) == -1) {
                perror("select");
                return;
            }
            // run through the existing connections looking for data to read
            int i;
            for(i = 0; i <= fdMax; i++) {
                // socket i has data to read
                if (FD_ISSET(i, &tmpSet)) {
                    if (i == listener) {
                        if(!clientConnected)
                        {
                            // handle new connections
                            struct sockaddr_in sockaddr;
                            socklen_t sockaddrLength = sizeof(sockaddr);
                            newSock = accept(listener, (struct sockaddr*) &sockaddr, &sockaddrLength);
                            if (newSock == -1) {
                                printf("Cannot accept connection\n");
                                return;
                            }
                            // add to master set
                            FD_SET(newSock, &master);
                            // watch out for new maximum
                            if (newSock > fdMax) {
                                fdMax = newSock;
                            }
                            char *remoteAddr;
                            getAddress((struct sockaddr*) &sockaddr, &remoteAddr);
                            printf("Connection accepted from IP %s\n", remoteAddr);
                            free(remoteAddr);
                        }
                        else
                        {
                            std::cerr << "Different client tried to connect";
                        }
                    } else {
                        // handle data from a client
                        int readBytes;
                        char buf[2];
                        if ((readBytes = recv(i, buf, sizeof buf, 0)) <= 0) {
                            // got error or connection closed by client
                            if (readBytes == 0) {
                            // connection closed
                            printf("Socket %d is closed\n", i);
                            } else {
                                perror("recv");
                            }
                            close(i); // bye!
                            FD_CLR(i, &master); // remove from master set
                        } else {
                            // we got some data from a client
                                        if (send(i, buf, readBytes, 0) == -1) {
                                            perror("send");
                                        }
                                        this->command = std::string(buf);
                                        std::cout << "we got command! " << this->command << std::endl;
                                    }
                                }
                            }
                        }
                    }
}